

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O1

var __thiscall cs::runtime_type::parse_expr(runtime_type *this,iterator *it,bool disable_parallel)

{
  token_base *ptVar1;
  _func_int **pp_Var2;
  tree_node *ptVar3;
  _Elt_pointer paVar4;
  runtime_type *prVar5;
  int iVar6;
  proxy *__tmp;
  token_base **pptVar7;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *pdVar8;
  var *pvVar9;
  proxy *ppVar10;
  iterator b;
  internal_error *piVar11;
  runtime_error *prVar12;
  char in_CL;
  bool disable_parallel_00;
  undefined7 in_register_00000011;
  iterator *this_00;
  _func_int **pp_Var13;
  _Map_pointer ppaVar14;
  CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
  CVar15;
  any *this_01;
  any *this_02;
  tree_type<cs::token_base_*> *tree;
  _func_int **pp_Var16;
  _Elt_pointer paVar17;
  size_t sVar18;
  _Elt_pointer paVar19;
  aligned_type *paVar20;
  var val;
  array arr;
  undefined1 local_118 [16];
  runtime_type *local_108;
  undefined1 local_100 [8];
  undefined1 local_f8 [16];
  proxy local_e8;
  CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
  CStack_d0;
  aligned_type *local_c8;
  flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pfStack_c0;
  domain_type *local_b8;
  aligned_type *paStack_b0;
  aligned_type *local_a8;
  undefined1 local_a0 [16];
  undefined1 local_90 [16];
  undefined1 local_80 [16];
  undefined1 local_70 [32];
  undefined1 local_50 [8];
  CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  aligned_type *local_40;
  aligned_type *local_38;
  
  this_00 = (iterator *)CONCAT71(in_register_00000011,disable_parallel);
  this_02 = (any *)local_118;
  local_108 = this;
  if (this_00->mData == (tree_node *)0x0) {
    piVar11 = (internal_error *)__cxa_allocate_exception(0x28);
    local_f8._0_8_ = local_f8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_f8,"The expression tree is not available.","");
    internal_error::internal_error(piVar11,(string *)local_f8);
    __cxa_throw(piVar11,&internal_error::typeinfo,internal_error::~internal_error);
  }
  pptVar7 = tree_type<cs::token_base_*>::iterator::data(this_00);
  ptVar1 = *pptVar7;
  if (ptVar1 == (token_base *)0x0) {
    (local_108->literals).
    super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
    .
    super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
    .ctrl_ = (ctrl_t *)0x0;
    return (var)(proxy *)local_108;
  }
  iVar6 = (*ptVar1->_vptr_token_base[2])(ptVar1);
  prVar5 = local_108;
  disable_parallel_00 = SUB81(local_118,0);
  switch(iVar6) {
  case 3:
    break;
  case 4:
    pvVar9 = domain_manager::get_var((domain_manager *)(it + 6),(var_id *)(ptVar1 + 1));
    ppVar10 = pvVar9->mDat;
    goto LAB_0025e626;
  case 5:
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x28);
    local_f8._0_8_ = local_f8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_f8,"Wrong declaration of variable argument list.","");
    runtime_error::runtime_error(prVar12,(string *)local_f8);
    __cxa_throw(prVar12,&runtime_error::typeinfo,runtime_error::~runtime_error);
  case 6:
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x28);
    local_f8._0_8_ = local_f8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_f8,"Wrong expanding position.","");
    runtime_error::runtime_error(prVar12,(string *)local_f8);
    __cxa_throw(prVar12,&runtime_error::typeinfo,runtime_error::~runtime_error);
  case 7:
    ppVar10 = (proxy *)ptVar1[1]._vptr_token_base;
LAB_0025e626:
    if (ppVar10 != (proxy *)0x0) {
      ppVar10->refcount = ppVar10->refcount + 1;
    }
    (local_108->literals).
    super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
    .
    super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
    .ctrl_ = &ppVar10->is_rvalue;
    return (var)(proxy *)local_108;
  case 8:
    get_string_literal(local_108,(string *)it,(string *)(ptVar1 + 1));
    return (var)(proxy *)prVar5;
  default:
switchD_0025e287_caseD_9:
    piVar11 = (internal_error *)__cxa_allocate_exception(0x28);
    local_f8._0_8_ = local_f8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_f8,"Unrecognized expression.","");
    internal_error::internal_error(piVar11,(string *)local_f8);
    __cxa_throw(piVar11,&internal_error::typeinfo,internal_error::~internal_error);
  case 0xc:
    local_f8._0_8_ = ptVar1[1]._vptr_token_base;
    parse_expr(local_108,it,SUB81(local_f8,0));
    return (var)(proxy *)local_108;
  case 0xe:
    local_b8 = (domain_type *)0x0;
    paStack_b0 = (aligned_type *)0x0;
    local_c8 = (aligned_type *)0x0;
    pfStack_c0 = (flat_hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x0;
    local_e8.data = (baseHolder *)0x0;
    CStack_d0.
    super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
    .
    super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
    .value = (CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
              )(Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
                )0x0;
    local_e8._0_8_ = (_Elt_pointer)0x0;
    local_e8.refcount = 0;
    local_f8._0_8_ = (proxy *)0x0;
    local_f8._8_8_ =
         (Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
          )0x0;
    local_70._16_8_ = it;
    std::_Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>::_M_initialize_map
              ((_Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_> *)local_f8,0);
    CVar15.
    super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
    .value = (Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
              )ptVar1[2]._vptr_token_base;
    paVar20 = (aligned_type *)ptVar1[4]._vptr_token_base;
    if (CVar15.
        super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
        .value != (Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
                   )paVar20) {
      local_70._24_8_ = ptVar1[3]._vptr_token_base;
      local_70._8_8_ = ptVar1[3].line_num;
      local_40 = paVar20;
      do {
        local_118._0_8_ =
             *(undefined8 *)
              CVar15.
              super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
              .value;
        pptVar7 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_118);
        ptVar1 = *pptVar7;
        if ((ptVar1 == (token_base *)0x0) ||
           (iVar6 = (*ptVar1->_vptr_token_base[2])(ptVar1), iVar6 != 6)) {
          local_100 = *(undefined1 (*) [8])
                       CVar15.
                       super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
                       .value;
          parse_expr((runtime_type *)local_50,(iterator *)local_70._16_8_,false);
          copy((EVP_PKEY_CTX *)local_118,(EVP_PKEY_CTX *)local_50);
          std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::emplace_back<cs_impl::any>
                    ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)local_f8,(any *)local_118
                    );
          cs_impl::any::recycle((any *)local_118);
          cs_impl::any::recycle((any *)local_50);
        }
        else {
          local_100 = (undefined1  [8])ptVar1[1]._vptr_token_base;
          parse_expr((runtime_type *)local_118,(iterator *)local_70._16_8_,false);
          local_38 = (aligned_type *)
                     CVar15.
                     super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
                     .value;
          pdVar8 = cs_impl::any::const_val<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>
                             ((any *)local_118);
          paVar19 = (pdVar8->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl
                    .super__Deque_impl_data._M_start._M_cur;
          paVar4 = (pdVar8->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
                   super__Deque_impl_data._M_finish._M_cur;
          if (paVar19 != paVar4) {
            paVar17 = (pdVar8->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                      _M_impl.super__Deque_impl_data._M_start._M_last;
            ppaVar14 = (pdVar8->super__Deque_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                       _M_impl.super__Deque_impl_data._M_start._M_node;
            do {
              local_48.
              super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
              .
              super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0UL,_false>
              .value = (CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
                        )paVar19->mDat;
              if (local_48.
                  super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
                  .
                  super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0UL,_false>
                  .value != (Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0UL,_false>
                             )0x0) {
                *(size_t *)
                 ((long)local_48.
                        super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
                        .
                        super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0UL,_false>
                        .value + 8) =
                     *(size_t *)
                      ((long)local_48.
                             super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
                             .
                             super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0UL,_false>
                             .value + 8) + 1;
              }
              copy((EVP_PKEY_CTX *)local_100,(EVP_PKEY_CTX *)&local_48);
              std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::emplace_back<cs_impl::any>
                        ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)local_f8,
                         (any *)local_100);
              cs_impl::any::recycle((any *)local_100);
              cs_impl::any::recycle((any *)&local_48);
              paVar19 = paVar19 + 1;
              if (paVar19 == paVar17) {
                paVar19 = ppaVar14[1];
                ppaVar14 = ppaVar14 + 1;
                paVar17 = paVar19 + 0x40;
              }
            } while (paVar19 != paVar4);
          }
          cs_impl::any::recycle((any *)local_118);
          CVar15.
          super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
          .value = (Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
                    )(Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
                      )local_38;
          paVar20 = local_40;
        }
        CVar15.
        super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
        .value = (Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
                  )((long)CVar15.
                          super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
                          .value + 8);
        if (CVar15.
            super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
            .value == (Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
                       )local_70._24_8_) {
          CVar15.
          super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
          .value = *(Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
                     *)(local_70._8_8_ + 8);
          local_70._8_8_ = local_70._8_8_ + 8;
          local_70._24_8_ =
               (long)CVar15.
                     super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
                     .value + 0x200;
        }
      } while (CVar15.
               super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
               .value != (Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>,_0UL,_false>
                          )paVar20);
    }
    cs_impl::any::
    make<std::deque<cs_impl::any,std::allocator<cs_impl::any>>,std::deque<cs_impl::any,std::allocator<cs_impl::any>>>
              ((any *)local_118,(deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)local_f8);
    rvalue((var *)local_118);
    cs_impl::any::recycle((any *)local_118);
    std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::~deque
              ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)local_f8);
    return (var)(proxy *)local_108;
  case 0xf:
    if (in_CL != '\0') {
      prVar12 = (runtime_error *)__cxa_allocate_exception(0x28);
      local_f8._0_8_ = local_f8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_f8,"Do not allowed parallel list.","");
      runtime_error::runtime_error(prVar12,(string *)local_f8);
      __cxa_throw(prVar12,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
    (local_108->literals).
    super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
    .
    super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
    .ctrl_ = (ctrl_t *)0x0;
    pp_Var16 = ptVar1[2]._vptr_token_base;
    pp_Var2 = ptVar1[4]._vptr_token_base;
    if (pp_Var16 == pp_Var2) {
      return (var)(proxy *)local_108;
    }
    pp_Var13 = ptVar1[3]._vptr_token_base;
    sVar18 = ptVar1[3].line_num;
    do {
      local_118._0_8_ = *pp_Var16;
      parse_expr((runtime_type *)local_f8,it,disable_parallel_00);
      if ((runtime_type *)local_f8 != local_108) {
        ptVar3 = (tree_node *)
                 (local_108->literals).
                 super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
                 .
                 super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
                 .ctrl_;
        (local_108->literals).
        super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
        .
        super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::callable>_>_>
        .ctrl_ = (ctrl_t *)local_f8._0_8_;
        local_f8._0_8_ = ptVar3;
      }
      cs_impl::any::recycle((any *)local_f8);
      pp_Var16 = pp_Var16 + 1;
      if (pp_Var16 == pp_Var13) {
        pp_Var16 = *(_func_int ***)(sVar18 + 8);
        sVar18 = sVar18 + 8;
        pp_Var13 = pp_Var16 + 0x40;
      }
    } while (pp_Var16 != pp_Var2);
    return (var)(proxy *)local_108;
  }
  switch(*(undefined4 *)&ptVar1[1]._vptr_token_base) {
  case 1:
    local_100 = (undefined1  [8])tree_type<cs::token_base_*>::iterator::left(this_00);
    parse_expr((runtime_type *)local_118,it,false);
    local_a8 = (aligned_type *)tree_type<cs::token_base_*>::iterator::right(this_00);
    parse_expr((runtime_type *)(local_118 + 8),it,SUB81(&local_a8,0));
    parse_add((runtime_type *)local_f8,(var *)it,(var *)local_118);
    rvalue((var *)local_f8);
    break;
  case 2:
    local_f8._0_8_ = tree_type<cs::token_base_*>::iterator::left(this_00);
    parse_expr((runtime_type *)local_70,it,SUB81(local_f8,0));
    local_100 = (undefined1  [8])tree_type<cs::token_base_*>::iterator::right(this_00);
    parse_expr((runtime_type *)local_118,it,false);
    parse_addasi(local_108,(var *)it,(var *)local_70);
    cs_impl::any::recycle((any *)local_118);
    this_02 = (any *)local_70;
    goto LAB_0025f2c2;
  case 3:
    local_100 = (undefined1  [8])tree_type<cs::token_base_*>::iterator::left(this_00);
    parse_expr((runtime_type *)local_118,it,false);
    local_a8 = (aligned_type *)tree_type<cs::token_base_*>::iterator::right(this_00);
    parse_expr((runtime_type *)(local_118 + 8),it,SUB81(&local_a8,0));
    parse_sub((runtime_type *)local_f8,(var *)it,(var *)local_118);
    rvalue((var *)local_f8);
    break;
  case 4:
    local_f8._0_8_ = tree_type<cs::token_base_*>::iterator::left(this_00);
    parse_expr((runtime_type *)(local_80 + 8),it,SUB81(local_f8,0));
    local_100 = (undefined1  [8])tree_type<cs::token_base_*>::iterator::right(this_00);
    parse_expr((runtime_type *)local_118,it,false);
    parse_subasi(local_108,(var *)it,(var *)(local_80 + 8));
    cs_impl::any::recycle((any *)local_118);
    this_02 = (any *)(local_80 + 8);
    goto LAB_0025f2c2;
  case 5:
    local_100 = (undefined1  [8])tree_type<cs::token_base_*>::iterator::left(this_00);
    parse_expr((runtime_type *)local_118,it,false);
    local_a8 = (aligned_type *)tree_type<cs::token_base_*>::iterator::right(this_00);
    parse_expr((runtime_type *)(local_118 + 8),it,SUB81(&local_a8,0));
    parse_mul((runtime_type *)local_f8,(var *)it,(var *)local_118);
    rvalue((var *)local_f8);
    break;
  case 6:
    local_f8._0_8_ = tree_type<cs::token_base_*>::iterator::left(this_00);
    parse_expr((runtime_type *)local_80,it,SUB81(local_f8,0));
    local_100 = (undefined1  [8])tree_type<cs::token_base_*>::iterator::right(this_00);
    parse_expr((runtime_type *)local_118,it,false);
    parse_mulasi(local_108,(var *)it,(var *)local_80);
    cs_impl::any::recycle((any *)local_118);
    this_02 = (any *)local_80;
    goto LAB_0025f2c2;
  case 7:
    local_100 = (undefined1  [8])tree_type<cs::token_base_*>::iterator::left(this_00);
    parse_expr((runtime_type *)local_118,it,false);
    local_a8 = (aligned_type *)tree_type<cs::token_base_*>::iterator::right(this_00);
    parse_expr((runtime_type *)(local_118 + 8),it,SUB81(&local_a8,0));
    parse_div((runtime_type *)local_f8,(var *)it,(var *)local_118);
    rvalue((var *)local_f8);
    break;
  case 8:
    local_f8._0_8_ = tree_type<cs::token_base_*>::iterator::left(this_00);
    parse_expr((runtime_type *)(local_90 + 8),it,SUB81(local_f8,0));
    local_100 = (undefined1  [8])tree_type<cs::token_base_*>::iterator::right(this_00);
    parse_expr((runtime_type *)local_118,it,false);
    parse_divasi(local_108,(var *)it,(var *)(local_90 + 8));
    cs_impl::any::recycle((any *)local_118);
    this_02 = (any *)(local_90 + 8);
    goto LAB_0025f2c2;
  case 9:
    local_100 = (undefined1  [8])tree_type<cs::token_base_*>::iterator::left(this_00);
    parse_expr((runtime_type *)local_118,it,false);
    local_a8 = (aligned_type *)tree_type<cs::token_base_*>::iterator::right(this_00);
    parse_expr((runtime_type *)(local_118 + 8),it,SUB81(&local_a8,0));
    parse_mod((runtime_type *)local_f8,(var *)it,(var *)local_118);
    rvalue((var *)local_f8);
    break;
  case 10:
    local_f8._0_8_ = tree_type<cs::token_base_*>::iterator::left(this_00);
    parse_expr((runtime_type *)local_90,it,SUB81(local_f8,0));
    local_100 = (undefined1  [8])tree_type<cs::token_base_*>::iterator::right(this_00);
    parse_expr((runtime_type *)local_118,it,false);
    parse_modasi(local_108,(var *)it,(var *)local_90);
    cs_impl::any::recycle((any *)local_118);
    this_02 = (any *)local_90;
    goto LAB_0025f2c2;
  case 0xb:
    local_100 = (undefined1  [8])tree_type<cs::token_base_*>::iterator::left(this_00);
    parse_expr((runtime_type *)local_118,it,false);
    local_a8 = (aligned_type *)tree_type<cs::token_base_*>::iterator::right(this_00);
    parse_expr((runtime_type *)(local_118 + 8),it,SUB81(&local_a8,0));
    parse_pow((runtime_type *)local_f8,(var *)it,(var *)local_118);
    rvalue((var *)local_f8);
    break;
  case 0xc:
    local_f8._0_8_ = tree_type<cs::token_base_*>::iterator::left(this_00);
    parse_expr((runtime_type *)(local_a0 + 8),it,SUB81(local_f8,0));
    local_100 = (undefined1  [8])tree_type<cs::token_base_*>::iterator::right(this_00);
    parse_expr((runtime_type *)local_118,it,false);
    parse_powasi(local_108,(var *)it,(var *)(local_a0 + 8));
    cs_impl::any::recycle((any *)local_118);
    this_02 = (any *)(local_a0 + 8);
    goto LAB_0025f2c2;
  default:
    goto switchD_0025e287_caseD_9;
  case 0xe:
    local_118._0_8_ = tree_type<cs::token_base_*>::iterator::left(this_00);
    parse_expr((runtime_type *)local_f8,it,disable_parallel_00);
    local_100 = (undefined1  [8])tree_type<cs::token_base_*>::iterator::right(this_00);
    tree_type<cs::token_base_*>::iterator::data((iterator *)local_100);
    parse_dot(local_108,(var *)it,(token_base *)local_f8);
    goto LAB_0025f2bd;
  case 0xf:
    local_100 = (undefined1  [8])tree_type<cs::token_base_*>::iterator::left(this_00);
    parse_expr((runtime_type *)local_118,it,false);
    local_a8 = (aligned_type *)tree_type<cs::token_base_*>::iterator::right(this_00);
    parse_expr((runtime_type *)(local_118 + 8),it,SUB81(&local_a8,0));
    parse_und((runtime_type *)local_f8,(var *)it,(var *)local_118);
    rvalue((var *)local_f8);
    break;
  case 0x10:
    local_100 = (undefined1  [8])tree_type<cs::token_base_*>::iterator::left(this_00);
    parse_expr((runtime_type *)local_118,it,false);
    local_a8 = (aligned_type *)tree_type<cs::token_base_*>::iterator::right(this_00);
    parse_expr((runtime_type *)(local_118 + 8),it,SUB81(&local_a8,0));
    parse_abo((runtime_type *)local_f8,(var *)it,(var *)local_118);
    rvalue((var *)local_f8);
    break;
  case 0x11:
    local_f8._0_8_ = tree_type<cs::token_base_*>::iterator::left(this_00);
    parse_expr((runtime_type *)local_a0,it,SUB81(local_f8,0));
    local_100 = (undefined1  [8])tree_type<cs::token_base_*>::iterator::right(this_00);
    parse_expr((runtime_type *)local_118,it,false);
    parse_asi(local_108,(var *)it,(var *)local_a0);
    cs_impl::any::recycle((any *)local_118);
    this_02 = (any *)local_a0;
    goto LAB_0025f2c2;
  case 0x12:
    b = tree_type<cs::token_base_*>::iterator::left(this_00);
    local_118._0_8_ = tree_type<cs::token_base_*>::iterator::right(this_00);
    parse_expr((runtime_type *)local_f8,it,disable_parallel_00);
    parse_lnkasi(local_108,(iterator)it,(var *)b.mData);
    goto LAB_0025f2bd;
  case 0x13:
    local_100 = (undefined1  [8])tree_type<cs::token_base_*>::iterator::left(this_00);
    parse_expr((runtime_type *)local_118,it,false);
    local_a8 = (aligned_type *)tree_type<cs::token_base_*>::iterator::right(this_00);
    parse_expr((runtime_type *)(local_118 + 8),it,SUB81(&local_a8,0));
    parse_equ((runtime_type *)local_f8,(var *)it,(var *)local_118);
    rvalue((var *)local_f8);
    break;
  case 0x14:
    local_100 = (undefined1  [8])tree_type<cs::token_base_*>::iterator::left(this_00);
    parse_expr((runtime_type *)local_118,it,false);
    local_a8 = (aligned_type *)tree_type<cs::token_base_*>::iterator::right(this_00);
    parse_expr((runtime_type *)(local_118 + 8),it,SUB81(&local_a8,0));
    parse_ueq((runtime_type *)local_f8,(var *)it,(var *)local_118);
    rvalue((var *)local_f8);
    break;
  case 0x15:
    local_100 = (undefined1  [8])tree_type<cs::token_base_*>::iterator::left(this_00);
    parse_expr((runtime_type *)local_118,it,false);
    local_a8 = (aligned_type *)tree_type<cs::token_base_*>::iterator::right(this_00);
    parse_expr((runtime_type *)(local_118 + 8),it,SUB81(&local_a8,0));
    parse_aeq((runtime_type *)local_f8,(var *)it,(var *)local_118);
    rvalue((var *)local_f8);
    break;
  case 0x16:
    local_100 = (undefined1  [8])tree_type<cs::token_base_*>::iterator::left(this_00);
    parse_expr((runtime_type *)local_118,it,false);
    local_a8 = (aligned_type *)tree_type<cs::token_base_*>::iterator::right(this_00);
    parse_expr((runtime_type *)(local_118 + 8),it,SUB81(&local_a8,0));
    parse_neq((runtime_type *)local_f8,(var *)it,(var *)local_118);
    rvalue((var *)local_f8);
    break;
  case 0x17:
    local_118._0_8_ = tree_type<cs::token_base_*>::iterator::left(this_00);
    local_100 = (undefined1  [8])tree_type<cs::token_base_*>::iterator::right(this_00);
    parse_and((runtime_type *)local_f8,it,(iterator *)local_118);
    rvalue((var *)local_f8);
    goto LAB_0025f2bd;
  case 0x18:
    local_118._0_8_ = tree_type<cs::token_base_*>::iterator::left(this_00);
    local_100 = (undefined1  [8])tree_type<cs::token_base_*>::iterator::right(this_00);
    parse_or((runtime_type *)local_f8,it,(iterator *)local_118);
    rvalue((var *)local_f8);
    goto LAB_0025f2bd;
  case 0x19:
    local_100 = (undefined1  [8])tree_type<cs::token_base_*>::iterator::right(this_00);
    parse_expr((runtime_type *)local_118,it,false);
    parse_not((runtime_type *)local_f8,(var *)it);
    rvalue((var *)local_f8);
    goto LAB_0025f10a;
  case 0x1a:
    local_118._0_8_ = tree_type<cs::token_base_*>::iterator::left(this_00);
    parse_expr((runtime_type *)local_f8,it,disable_parallel_00);
    local_118._8_8_ = tree_type<cs::token_base_*>::iterator::right(this_00);
    parse_expr((runtime_type *)local_100,it,(bool)((char)local_118 + '\b'));
    parse_inc(local_108,(var *)it,(var *)local_f8);
    goto LAB_0025f2b3;
  case 0x1b:
    local_118._0_8_ = tree_type<cs::token_base_*>::iterator::left(this_00);
    parse_expr((runtime_type *)local_f8,it,disable_parallel_00);
    local_118._8_8_ = tree_type<cs::token_base_*>::iterator::right(this_00);
    parse_expr((runtime_type *)local_100,it,(bool)((char)local_118 + '\b'));
    parse_dec(local_108,(var *)it,(var *)local_f8);
    goto LAB_0025f2b3;
  case 0x1c:
    local_100 = (undefined1  [8])tree_type<cs::token_base_*>::iterator::left(this_00);
    parse_expr((runtime_type *)local_118,it,false);
    local_a8 = (aligned_type *)tree_type<cs::token_base_*>::iterator::right(this_00);
    parse_expr((runtime_type *)(local_118 + 8),it,SUB81(&local_a8,0));
    parse_pair((runtime_type *)local_f8,(var *)it,(var *)local_118);
    rvalue((var *)local_f8);
    break;
  case 0x1d:
    local_118._0_8_ = tree_type<cs::token_base_*>::iterator::left(this_00);
    parse_expr((runtime_type *)local_f8,it,disable_parallel_00);
    local_100 = (undefined1  [8])tree_type<cs::token_base_*>::iterator::right(this_00);
    parse_choice(local_108,(var *)it,(iterator *)local_f8);
    goto LAB_0025f2bd;
  case 0x27:
    local_118._0_8_ = tree_type<cs::token_base_*>::iterator::left(this_00);
    parse_expr((runtime_type *)local_f8,it,disable_parallel_00);
    local_100 = (undefined1  [8])tree_type<cs::token_base_*>::iterator::right(this_00);
    tree_type<cs::token_base_*>::iterator::data((iterator *)local_100);
    parse_fcall(local_108,(var *)it,(token_base *)local_f8);
    goto LAB_0025f2bd;
  case 0x28:
    local_118._0_8_ = tree_type<cs::token_base_*>::iterator::left(this_00);
    parse_expr((runtime_type *)local_f8,it,disable_parallel_00);
    local_118._8_8_ = tree_type<cs::token_base_*>::iterator::right(this_00);
    parse_expr((runtime_type *)local_100,it,(bool)((char)local_118 + '\b'));
    parse_access(local_108,(var *)it,(var *)local_f8);
LAB_0025f2b3:
    cs_impl::any::recycle((any *)local_100);
    goto LAB_0025f2bd;
  case 0x29:
    local_100 = (undefined1  [8])tree_type<cs::token_base_*>::iterator::right(this_00);
    parse_expr((runtime_type *)local_118,it,false);
    parse_typeid((runtime_type *)local_f8,(var *)it);
    rvalue((var *)local_f8);
    goto LAB_0025f10a;
  case 0x2a:
    local_100 = (undefined1  [8])tree_type<cs::token_base_*>::iterator::right(this_00);
    parse_expr((runtime_type *)local_118,it,false);
    cs_impl::any::make<cs::pointer,cs_impl::any_const&>((any *)local_f8,(any *)local_118);
    rvalue((var *)local_f8);
    goto LAB_0025f10a;
  case 0x2b:
    local_100 = (undefined1  [8])tree_type<cs::token_base_*>::iterator::right(this_00);
    parse_expr((runtime_type *)local_118,it,false);
    parse_new((runtime_type *)local_f8,(var *)it);
    rvalue((var *)local_f8);
    goto LAB_0025f10a;
  case 0x2c:
    local_100 = (undefined1  [8])tree_type<cs::token_base_*>::iterator::right(this_00);
    parse_expr((runtime_type *)local_118,it,false);
    parse_gcnew((runtime_type *)local_f8,(var *)it);
    rvalue((var *)local_f8);
    goto LAB_0025f10a;
  case 0x2d:
    local_118._0_8_ = tree_type<cs::token_base_*>::iterator::left(this_00);
    parse_expr((runtime_type *)local_f8,it,disable_parallel_00);
    local_100 = (undefined1  [8])tree_type<cs::token_base_*>::iterator::right(this_00);
    tree_type<cs::token_base_*>::iterator::data((iterator *)local_100);
    parse_arrow(local_108,(var *)it,(token_base *)local_f8);
    goto LAB_0025f2bd;
  case 0x2f:
    local_118._0_8_ = tree_type<cs::token_base_*>::iterator::right(this_00);
    parse_expr((runtime_type *)local_f8,it,disable_parallel_00);
    parse_escape(local_108,(var *)it);
LAB_0025f2bd:
    this_02 = (any *)local_f8;
    goto LAB_0025f2c2;
  case 0x30:
    local_100 = (undefined1  [8])tree_type<cs::token_base_*>::iterator::right(this_00);
    parse_expr((runtime_type *)local_118,it,false);
    parse_minus((runtime_type *)local_f8,(var *)it);
    rvalue((var *)local_f8);
LAB_0025f10a:
    this_01 = (any *)local_f8;
    goto LAB_0025f17d;
  case 0x35:
    local_f8._0_8_ = tree_type<cs::token_base_*>::iterator::left(this_00);
    pptVar7 = tree_type<cs::token_base_*>::iterator::data((iterator *)local_f8);
    ptVar1 = *pptVar7;
    local_100 = (undefined1  [8])tree_type<cs::token_base_*>::iterator::right(this_00);
    parse_expr((runtime_type *)local_118,it,false);
    parse_bind(local_108,(token_base *)it,(var *)ptVar1);
    this_02 = (any *)local_118;
    goto LAB_0025f2c2;
  }
  cs_impl::any::recycle((any *)local_f8);
  this_01 = (any *)(local_118 + 8);
LAB_0025f17d:
  cs_impl::any::recycle(this_01);
LAB_0025f2c2:
  cs_impl::any::recycle(this_02);
  return (var)(proxy *)local_108;
}

Assistant:

var runtime_type::parse_expr(const tree_type<token_base *>::iterator &it, bool disable_parallel)
	{
		if (!it.usable())
			throw internal_error("The expression tree is not available.");
		token_base *token = it.data();
		if (token == nullptr)
			return var();
		switch (token->get_type()) {
		default:
			break;
		case token_types::vargs:
			throw runtime_error("Wrong declaration of variable argument list.");
			break;
		case token_types::expand:
			throw runtime_error("Wrong expanding position.");
			break;
		case token_types::id:
			return storage.get_var(static_cast<token_id *>(token)->get_id());
			break;
		case token_types::literal: {
			token_literal *ptr = static_cast<token_literal *>(token);
			return get_string_literal(ptr->get_data(), ptr->get_literal());
		}
		case token_types::value:
			return static_cast<token_value *>(token)->get_value();
			break;
		case token_types::expr:
			return parse_expr(static_cast<token_expr *>(token)->get_tree().root());
			break;
		case token_types::array: {
			array arr;
			token_base *ptr = nullptr;
			for (auto &tree: static_cast<token_array *>(token)->get_array()) {
				ptr = tree.root().data();
				if (ptr != nullptr && ptr->get_type() == token_types::expand) {
					var val = parse_expr(static_cast<token_expand *>(ptr)->get_tree().root());
					const auto &child_arr = val.const_val<array>();
					for (auto &it: child_arr)
						arr.push_back(copy(it));
				}
				else
					arr.push_back(copy(parse_expr(tree.root())));
			}
			return rvalue(var::make<array>(std::move(arr)));
		}
		case token_types::parallel: {
			if (disable_parallel)
				throw runtime_error("Do not allowed parallel list.");
			var result;
			for (auto &tree: static_cast<token_parallel *>(token)->get_parallel())
				result = parse_expr(tree.root());
			return result;
		}
		case token_types::signal: {
			switch (static_cast<token_signal *>(token)->get_signal()) {
			default:
				break;
			case signal_types::add_:
				return rvalue(parse_add(parse_expr(it.left()), parse_expr(it.right())));
				break;
			case signal_types::addasi_:
				return parse_addasi(parse_expr(it.left()), parse_expr(it.right()));
				break;
			case signal_types::sub_:
				return rvalue(parse_sub(parse_expr(it.left()), parse_expr(it.right())));
				break;
			case signal_types::subasi_:
				return parse_subasi(parse_expr(it.left()), parse_expr(it.right()));
				break;
			case signal_types::minus_:
				return rvalue(parse_minus(parse_expr(it.right())));
				break;
			case signal_types::mul_:
				return rvalue(parse_mul(parse_expr(it.left()), parse_expr(it.right())));
				break;
			case signal_types::mulasi_:
				return parse_mulasi(parse_expr(it.left()), parse_expr(it.right()));
				break;
			case signal_types::escape_:
				return parse_escape(parse_expr(it.right()));
				break;
			case signal_types::div_:
				return rvalue(parse_div(parse_expr(it.left()), parse_expr(it.right())));
				break;
			case signal_types::divasi_:
				return parse_divasi(parse_expr(it.left()), parse_expr(it.right()));
				break;
			case signal_types::mod_:
				return rvalue(parse_mod(parse_expr(it.left()), parse_expr(it.right())));
				break;
			case signal_types::modasi_:
				return parse_modasi(parse_expr(it.left()), parse_expr(it.right()));
				break;
			case signal_types::pow_:
				return rvalue(parse_pow(parse_expr(it.left()), parse_expr(it.right())));
				break;
			case signal_types::powasi_:
				return parse_powasi(parse_expr(it.left()), parse_expr(it.right()));
				break;
			case signal_types::dot_:
				return parse_dot(parse_expr(it.left()), it.right().data());
				break;
			case signal_types::arrow_:
				return parse_arrow(parse_expr(it.left()), it.right().data());
				break;
			case signal_types::typeid_:
				return rvalue(parse_typeid(parse_expr(it.right())));
				break;
			case signal_types::new_:
				return rvalue(parse_new(parse_expr(it.right())));
				break;
			case signal_types::gcnew_:
				return rvalue(parse_gcnew(parse_expr(it.right())));
				break;
			case signal_types::und_:
				return rvalue(parse_und(parse_expr(it.left()), parse_expr(it.right())));
				break;
			case signal_types::abo_:
				return rvalue(parse_abo(parse_expr(it.left()), parse_expr(it.right())));
				break;
			case signal_types::asi_:
				return parse_asi(parse_expr(it.left()), parse_expr(it.right()));
				break;
			case signal_types::lnkasi_:
				return parse_lnkasi(it.left(), parse_expr(it.right()));
				break;
			case signal_types::bind_:
				return parse_bind(it.left().data(), parse_expr(it.right()));
				break;
			case signal_types::choice_:
				return parse_choice(parse_expr(it.left()), it.right());
				break;
			case signal_types::pair_:
				return rvalue(parse_pair(parse_expr(it.left()), parse_expr(it.right())));
				break;
			case signal_types::equ_:
				return rvalue(parse_equ(parse_expr(it.left()), parse_expr(it.right())));
				break;
			case signal_types::ueq_:
				return rvalue(parse_ueq(parse_expr(it.left()), parse_expr(it.right())));
				break;
			case signal_types::aeq_:
				return rvalue(parse_aeq(parse_expr(it.left()), parse_expr(it.right())));
				break;
			case signal_types::neq_:
				return rvalue(parse_neq(parse_expr(it.left()), parse_expr(it.right())));
				break;
			case signal_types::and_:
				return rvalue(parse_and(it.left(), it.right()));
				break;
			case signal_types::or_:
				return rvalue(parse_or(it.left(), it.right()));
				break;
			case signal_types::not_:
				return rvalue(parse_not(parse_expr(it.right())));
				break;
			case signal_types::inc_:
				return parse_inc(parse_expr(it.left()), parse_expr(it.right()));
				break;
			case signal_types::dec_:
				return parse_dec(parse_expr(it.left()), parse_expr(it.right()));
				break;
			case signal_types::addr_:
				return rvalue(parse_addr(parse_expr(it.right())));
				break;
			case signal_types::fcall_:
				return parse_fcall(parse_expr(it.left()), it.right().data());
				break;
			case signal_types::access_:
				return parse_access(parse_expr(it.left()), parse_expr(it.right()));
				break;
			}
		}
		}
		throw internal_error("Unrecognized expression.");
	}